

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Run(cmake *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool noconfigure)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string message;
  ifstream fin;
  string local_258;
  string local_238;
  byte abStack_218 [488];
  
  SetArgs(this,args);
  if (((cmSystemTools::s_ErrorOccurred != false) || (cmSystemTools::s_FatalErrorOccurred != false))
     || (bVar1 = cmSystemTools::GetInterruptFlag(), bVar1)) {
LAB_002a505d:
    iVar3 = -1;
  }
  else {
    if (this->CurrentWorkingMode != HELP_MODE) {
      if (this->Trace == true) {
        PrintTraceFormatVersion(this);
      }
      if ((this->CheckStampList)._M_string_length != 0) {
        bVar1 = cmsys::SystemTools::FileExists(&this->CheckStampList);
        if (bVar1) {
          std::ifstream::ifstream(&local_238,(this->CheckStampList)._M_dataplus._M_p,_S_in);
          if ((abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0) {
            local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
            local_258._M_string_length = 0;
            local_258.field_2._M_local_buf[0] = '\0';
            do {
              bVar1 = cmsys::SystemTools::GetLineFromStream
                                ((istream *)&local_238,&local_258,(bool *)0x0,0xffffffffffffffff);
              if (!bVar1) break;
              bVar2 = cmakeCheckStampFile(&local_258);
            } while (bVar2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_258._M_dataplus._M_p != &local_258.field_2) {
              operator_delete(local_258._M_dataplus._M_p,
                              CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                       local_258.field_2._M_local_buf[0]) + 1);
            }
            std::ifstream::~ifstream(&local_238);
            if (!bVar1) {
              return 0;
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"CMake is re-running because generate.stamp.list ",0x30
                      );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"could not be read.\n",0x13);
            std::ifstream::~ifstream(&local_238);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"CMake is re-running because generate.stamp.list ",0x30);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"is missing.\n",0xc);
        }
      }
      if (((this->CheckStampFile)._M_string_length == 0) ||
         (bVar1 = cmakeCheckStampFile(&this->CheckStampFile), !bVar1)) {
        if (this->CurrentWorkingMode == NORMAL_MODE) {
          if (this->FreshCache != false) {
            psVar4 = cmState::GetBinaryDirectory_abi_cxx11_
                               ((this->State)._M_t.
                                super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
            cmState::DeleteCache
                      ((this->State)._M_t.
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl,psVar4);
          }
          iVar3 = LoadCache(this);
          if (-1 < iVar3) goto LAB_002a5210;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Error executing cmake::LoadCache(). Aborting.\n","");
          cmSystemTools::Error(&local_238);
        }
        else if (this->FreshCache == false) {
          AddCMakePaths(this);
LAB_002a5210:
          ProcessPresetVariables(this);
          ProcessPresetEnvironment(this);
          bVar1 = SetCacheArgs(this,args);
          if (bVar1) {
            PrintPresetVariables(this);
            PrintPresetEnvironment(this);
            if (this->CurrentWorkingMode != NORMAL_MODE) {
              if (cmSystemTools::s_ErrorOccurred == false) {
                if (cmSystemTools::s_FatalErrorOccurred != false) {
                  return -1;
                }
                bVar1 = cmSystemTools::GetInterruptFlag();
                return -(uint)bVar1;
              }
              goto LAB_002a505d;
            }
            bVar1 = cmsys::SystemTools::HasEnv("MAKEFLAGS");
            if (bVar1) {
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"MAKEFLAGS=","");
              cmsys::SystemTools::PutEnv(&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p != &local_238.field_2) {
                operator_delete(local_238._M_dataplus._M_p,
                                local_238.field_2._M_allocated_capacity + 1);
              }
            }
            PreLoadCMakeFiles(this);
            if ((!noconfigure) && (iVar3 = CheckBuildSystem(this), iVar3 != 0)) {
              iVar3 = Configure(this);
              if (iVar3 != 0) {
                return iVar3;
              }
              iVar3 = Generate(this);
              if (iVar3 != 0) {
                local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_238,
                           "CMake Generate step failed.  Build files cannot be regenerated correctly."
                           ,"");
                cmSystemTools::Message(&local_238,(char *)0x0);
                goto LAB_002a52a6;
              }
              psVar4 = cmState::GetBinaryDirectory_abi_cxx11_
                                 ((this->State)._M_t.
                                  super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
                                  .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                  super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
              local_238.field_2._8_8_ = (psVar4->_M_dataplus)._M_p;
              local_238.field_2._M_allocated_capacity = psVar4->_M_string_length;
              local_238._M_dataplus._M_p = (pointer)0x22;
              local_238._M_string_length = 0x6ff7b4;
              views._M_len = 2;
              views._M_array = (iterator)&local_238;
              cmCatViews_abi_cxx11_(&local_258,views);
              UpdateProgress(this,&local_258,-1.0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258._M_dataplus._M_p != &local_258.field_2) {
                operator_delete(local_258._M_dataplus._M_p,
                                CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                         local_258.field_2._M_local_buf[0]) + 1);
              }
            }
            goto LAB_002a515f;
          }
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"Run \'cmake --help\' for all supported options.","");
          cmSystemTools::Error(&local_238);
        }
        else {
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_238,"--fresh allowed only when configuring a project","");
          cmSystemTools::Error(&local_238);
        }
LAB_002a52a6:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002a505d;
      }
    }
LAB_002a515f:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int cmake::Run(const std::vector<std::string>& args, bool noconfigure)
{
  // Process the arguments
  this->SetArgs(args);
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  if (this->GetWorkingMode() == HELP_MODE) {
    return 0;
  }

  // Log the trace format version to the desired output
  if (this->GetTrace()) {
    this->PrintTraceFormatVersion();
  }

  // If we are given a stamp list file check if it is really out of date.
  if (!this->CheckStampList.empty() &&
      cmakeCheckStampList(this->CheckStampList)) {
    return 0;
  }

  // If we are given a stamp file check if it is really out of date.
  if (!this->CheckStampFile.empty() &&
      cmakeCheckStampFile(this->CheckStampFile)) {
    return 0;
  }

  if (this->GetWorkingMode() == NORMAL_MODE) {
    if (this->FreshCache) {
      this->DeleteCache(this->GetHomeOutputDirectory());
    }
    // load the cache
    if (this->LoadCache() < 0) {
      cmSystemTools::Error("Error executing cmake::LoadCache(). Aborting.\n");
      return -1;
    }
  } else {
    if (this->FreshCache) {
      cmSystemTools::Error("--fresh allowed only when configuring a project");
      return -1;
    }
    this->AddCMakePaths();
  }

#ifndef CMAKE_BOOTSTRAP
  this->ProcessPresetVariables();
  this->ProcessPresetEnvironment();
#endif
  // Add any cache args
  if (!this->SetCacheArgs(args)) {
    cmSystemTools::Error("Run 'cmake --help' for all supported options.");
    return -1;
  }
#ifndef CMAKE_BOOTSTRAP
  this->PrintPresetVariables();
  this->PrintPresetEnvironment();
#endif

  // In script mode we terminate after running the script.
  if (this->GetWorkingMode() != NORMAL_MODE) {
    if (cmSystemTools::GetErrorOccurredFlag()) {
      return -1;
    }
    return 0;
  }

  // If MAKEFLAGS are given in the environment, remove the environment
  // variable.  This will prevent try-compile from succeeding when it
  // should fail (if "-i" is an option).  We cannot simply test
  // whether "-i" is given and remove it because some make programs
  // encode the MAKEFLAGS variable in a strange way.
  if (cmSystemTools::HasEnv("MAKEFLAGS")) {
    cmSystemTools::PutEnv("MAKEFLAGS=");
  }

  this->PreLoadCMakeFiles();

  if (noconfigure) {
    return 0;
  }

  // now run the global generate
  // Check the state of the build system to see if we need to regenerate.
  if (!this->CheckBuildSystem()) {
    return 0;
  }

  int ret = this->Configure();
  if (ret) {
#if defined(CMAKE_HAVE_VS_GENERATORS)
    if (!this->VSSolutionFile.empty() && this->GlobalGenerator) {
      // CMake is running to regenerate a Visual Studio build tree
      // during a build from the VS IDE.  The build files cannot be
      // regenerated, so we should stop the build.
      cmSystemTools::Message("CMake Configure step failed.  "
                             "Build files cannot be regenerated correctly.  "
                             "Attempting to stop IDE build.");
      cmGlobalVisualStudioGenerator& gg =
        cm::static_reference_cast<cmGlobalVisualStudioGenerator>(
          this->GlobalGenerator);
      gg.CallVisualStudioMacro(cmGlobalVisualStudioGenerator::MacroStop,
                               this->VSSolutionFile);
    }
#endif
    return ret;
  }
  ret = this->Generate();
  if (ret) {
    cmSystemTools::Message("CMake Generate step failed.  "
                           "Build files cannot be regenerated correctly.");
    return ret;
  }
  std::string message = cmStrCat("Build files have been written to: ",
                                 this->GetHomeOutputDirectory());
  this->UpdateProgress(message, -1);
  return ret;
}